

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

void polygon_web_init(Am_Slot *slot,Am_Web_Init *init)

{
  Am_Object_Advanced obj;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Slot::Get_Owner((Am_Slot *)&obj);
  Am_Object::Am_Object(&local_18,&obj.super_Am_Object);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_18,0xb2);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&local_20,&obj.super_Am_Object);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_20,100);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_28,&obj.super_Am_Object);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_28,0x65);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,&obj.super_Am_Object);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_30,0x66);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&obj.super_Am_Object);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_38,0x67);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object(&local_40,&obj.super_Am_Object);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_40,0x6b);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&local_48,&obj.super_Am_Object);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_48,0xb2);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,&obj.super_Am_Object);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_50,0x65);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,&obj.super_Am_Object);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_58,0x66);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&local_60,&obj.super_Am_Object);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_60,0x67);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&obj.super_Am_Object);
  return;
}

Assistant:

static void
polygon_web_init(const Am_Slot &slot, Am_Web_Init &init)
{
  Am_Object_Advanced obj = slot.Get_Owner();
  init.Note_Input(obj, Am_POINT_LIST);
  init.Note_Input(obj, Am_LEFT);
  init.Note_Input(obj, Am_TOP);
  init.Note_Input(obj, Am_WIDTH);
  init.Note_Input(obj, Am_HEIGHT);
  init.Note_Input(obj, Am_LINE_STYLE);
  init.Note_Output(obj, Am_POINT_LIST);
  init.Note_Output(obj, Am_TOP);
  init.Note_Output(obj, Am_WIDTH);
  init.Note_Output(obj, Am_HEIGHT);
}